

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

double __thiscall HPresolve::getRowDualPost(HPresolve *this,int row,int col)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  
  uVar11 = (ulong)col;
  piVar4 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
  uVar14 = uVar11;
  if (uVar11 < uVar8) {
    piVar5 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
    uVar8 = uVar9;
    if (uVar11 < uVar9) {
      iVar3 = piVar4[uVar11];
      uVar12 = (ulong)iVar3;
      iVar10 = piVar5[uVar11];
      piVar4 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar15 = (long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2;
      piVar5 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar16 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
      pdVar6 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar17 = (long)(this->super_HPreData).Avalue.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
      pdVar7 = (this->super_HPreData).valueRowDual.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar18 = (long)(this->super_HPreData).valueRowDual.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
      if (iVar10 < iVar3) {
        iVar10 = iVar3;
      }
      dVar21 = 0.0;
      uVar13 = uVar12;
      while( true ) {
        if ((long)iVar10 == uVar13) {
          pdVar6 = (this->super_HPreData).colCostAtEl.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = (long)(this->super_HPreData).colCostAtEl.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
          uVar14 = uVar11;
          if (uVar11 < uVar8) {
            pdVar7 = (this->super_HPreData).valueColDual.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = (long)(this->super_HPreData).valueColDual.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
            if (uVar11 < uVar8) {
              dVar1 = pdVar6[uVar11];
              dVar2 = pdVar7[uVar11];
              dVar20 = HPreData::getaij(&this->super_HPreData,row,col);
              return -((dVar21 + dVar1) - dVar2) / dVar20;
            }
          }
          goto LAB_00149b61;
        }
        if (uVar15 <= uVar13) break;
        iVar3 = piVar4[uVar13];
        uVar19 = (ulong)iVar3;
        uVar8 = uVar16;
        uVar14 = uVar19;
        if (uVar16 <= uVar19) goto LAB_00149b61;
        if ((iVar3 != row) && (piVar5[uVar19] != 0)) {
          uVar8 = uVar17;
          uVar14 = uVar13;
          if ((uVar17 <= uVar13) || (uVar8 = uVar18, uVar14 = uVar19, uVar18 <= uVar19))
          goto LAB_00149b61;
          dVar21 = dVar21 + pdVar6[uVar13] * pdVar7[uVar19];
        }
        uVar13 = uVar13 + 1;
        uVar8 = uVar9;
        uVar14 = uVar11;
        if (uVar9 <= uVar11) goto LAB_00149b61;
      }
      uVar8 = uVar15;
      uVar14 = uVar12;
      if (uVar12 < uVar15) {
        uVar14 = uVar15;
      }
    }
  }
LAB_00149b61:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
             uVar8);
}

Assistant:

double HPresolve::getRowDualPost(int row, int col) {
	double x = 0;

	for (int kk=Astart.at(col); kk<Aend.at(col);++kk)
		if (flagRow.at(Aindex.at(kk)) && Aindex.at(kk) != row)
			x = x + Avalue.at(kk)*valueRowDual.at(Aindex.at(kk));

	x = x + colCostAtEl.at(col) - valueColDual.at(col);

	double y=getaij(row,col);
	return -x/y;
}